

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.h
# Opt level: O0

StringRef __thiscall llvm::Twine::toStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  bool bVar1;
  Twine *pTVar2;
  size_t sVar3;
  SmallVectorImpl<char> *Out_local;
  Twine *this_local;
  undefined8 local_28;
  
  bVar1 = isSingleStringRef(this);
  if (bVar1) {
    _this_local = getSingleStringRef(this);
  }
  else {
    toVector(this,Out);
    pTVar2 = (Twine *)SmallVectorTemplateCommon<char,_void>::data
                                ((SmallVectorTemplateCommon<char,_void> *)Out);
    sVar3 = SmallVectorBase::size((SmallVectorBase *)Out);
    this_local = pTVar2;
    local_28 = sVar3;
  }
  return _this_local;
}

Assistant:

StringRef toStringRef(SmallVectorImpl<char> &Out) const {
      if (isSingleStringRef())
        return getSingleStringRef();
      toVector(Out);
      return StringRef(Out.data(), Out.size());
    }